

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

PC * __thiscall Hpipe::Context::without(PC *__return_storage_ptr__,Context *this,CharItem *fip)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ulong uVar3;
  PcMaker pm;
  PcMaker local_b8;
  
  anon_unknown_7::PcMaker::PcMaker(&local_b8,this);
  ppCVar1 = (this->pos).
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->pos).
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar2 != ppCVar1) {
    uVar3 = 0;
    do {
      if (ppCVar1[uVar3] != fip) {
        anon_unknown_7::PcMaker::add(&local_b8,ppCVar1[uVar3],(uint)uVar3,true);
        ppCVar1 = (this->pos).
                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppCVar2 = (this->pos).
                  super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar3 = (ulong)((uint)uVar3 + 1);
    } while (uVar3 < (ulong)((long)ppCVar2 - (long)ppCVar1 >> 3));
  }
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&local_b8.res);
  if (local_b8.res.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.res.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.res.second.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.res.second.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_b8.res.first.paths_to_strings._M_t);
  if (local_b8.res.first.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.res.first.paths_to_mark.
                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.res.first.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.res.first.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.res.first.pos.
      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.res.first.pos.
                    super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.res.first.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.res.first.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::without( const CharItem *fip ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i < pos.size(); ++i )
        if ( pos[ i ] != fip )
            pm.add( pos[ i ], i );

    return pm.out();
}